

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdesktopunixservices.cpp
# Opt level: O0

bool detectWebBrowser(QByteArray *desktop,bool checkBrowserVariable,QString *browser)

{
  QLatin1StringView latin1;
  bool bVar1;
  byte bVar2;
  QLatin1String *in_RDX;
  byte in_SIL;
  QArrayDataPointer<char16_t> *in_RDI;
  long in_FS_OFFSET;
  size_t i;
  char16_t *str;
  char16_t *str_2;
  char16_t *str_1;
  char16_t *str_3;
  QString browserVariable;
  char *browsers [4];
  undefined5 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbd;
  undefined1 in_stack_fffffffffffffdbe;
  undefined1 in_stack_fffffffffffffdbf;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffdc0;
  undefined7 in_stack_fffffffffffffdc8;
  byte in_stack_fffffffffffffdcf;
  QLatin1String *in_stack_fffffffffffffdd0;
  undefined6 in_stack_fffffffffffffdd8;
  byte in_stack_fffffffffffffdde;
  byte in_stack_fffffffffffffddf;
  ulong uVar3;
  char *in_stack_fffffffffffffdf8;
  byte local_1d1;
  QArrayDataPointer<char16_t> local_148 [2];
  QByteArray local_118;
  QArrayDataPointer<char16_t> local_100 [2];
  QArrayDataPointer<char16_t> local_d0 [2];
  QByteArray local_a0;
  char local_88 [24];
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  QArrayDataPointer<char16_t> local_58 [2];
  char *local_28;
  char *local_20;
  char *local_18;
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = "google-chrome";
  local_20 = "firefox";
  local_18 = "mozilla";
  local_10 = "opera";
  QString::clear((QString *)in_stack_fffffffffffffdc0);
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_58,(Data *)0x0,L"xdg-open",8);
  QString::QString((QString *)in_stack_fffffffffffffdc0,
                   (DataPointer *)
                   CONCAT17(in_stack_fffffffffffffdbf,
                            CONCAT16(in_stack_fffffffffffffdbe,
                                     CONCAT15(in_stack_fffffffffffffdbd,in_stack_fffffffffffffdb8)))
                  );
  bVar1 = checkExecutable((QString *)
                          CONCAT17(in_stack_fffffffffffffddf,
                                   CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)),
                          (QString *)in_stack_fffffffffffffdd0);
  QString::~QString((QString *)0xacb9e0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffdc0);
  if (bVar1) {
    local_1d1 = 1;
    goto LAB_00acbe6c;
  }
  if ((in_SIL & 1) != 0) {
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    qEnvironmentVariable((char *)&local_70);
    bVar1 = QString::isEmpty((QString *)0xacba5a);
    if (bVar1) {
      qEnvironmentVariable(local_88);
      QString::operator=((QString *)in_stack_fffffffffffffdc0,
                         (QString *)
                         CONCAT17(in_stack_fffffffffffffdbf,
                                  CONCAT16(in_stack_fffffffffffffdbe,
                                           CONCAT15(in_stack_fffffffffffffdbd,
                                                    in_stack_fffffffffffffdb8))));
      QString::~QString((QString *)0xacba96);
    }
    bVar1 = QString::isEmpty((QString *)0xacbaa3);
    if ((bVar1) ||
       (bVar1 = checkExecutable((QString *)
                                CONCAT17(in_stack_fffffffffffffddf,
                                         CONCAT16(in_stack_fffffffffffffdde,
                                                  in_stack_fffffffffffffdd8)),
                                (QString *)in_stack_fffffffffffffdd0), !bVar1)) {
      bVar1 = false;
    }
    else {
      local_1d1 = 1;
      bVar1 = true;
    }
    QString::~QString((QString *)0xacbae3);
    if (bVar1) goto LAB_00acbe6c;
  }
  QByteArray::QByteArray(&local_a0,"KDE",-1);
  bVar1 = operator==((QByteArray *)in_stack_fffffffffffffdd0,
                     (QByteArray *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
  QByteArray::~QByteArray((QByteArray *)0xacbb3c);
  if (bVar1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_d0,(Data *)0x0,L"kde-open5",9);
    QString::QString((QString *)in_stack_fffffffffffffdc0,
                     (DataPointer *)
                     CONCAT17(in_stack_fffffffffffffdbf,
                              CONCAT16(in_stack_fffffffffffffdbe,
                                       CONCAT15(in_stack_fffffffffffffdbd,in_stack_fffffffffffffdb8)
                                      )));
    in_stack_fffffffffffffddf =
         checkExecutable((QString *)
                         CONCAT17(in_stack_fffffffffffffddf,
                                  CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)),
                         (QString *)in_stack_fffffffffffffdd0);
    QString::~QString((QString *)0xacbbce);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffdc0);
    if ((in_stack_fffffffffffffddf & 1) != 0) {
      local_1d1 = 1;
      goto LAB_00acbe6c;
    }
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_100,(Data *)0x0,L"kfmclient",9);
    QString::QString((QString *)in_stack_fffffffffffffdc0,
                     (DataPointer *)
                     CONCAT17(in_stack_fffffffffffffdbf,
                              CONCAT16(in_stack_fffffffffffffdbe,
                                       CONCAT15(in_stack_fffffffffffffdbd,in_stack_fffffffffffffdb8)
                                      )));
    in_stack_fffffffffffffdde =
         checkExecutable((QString *)
                         CONCAT17(in_stack_fffffffffffffddf,
                                  CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)),
                         (QString *)in_stack_fffffffffffffdd0);
    QString::~QString((QString *)0xacbc74);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffdc0);
    if ((in_stack_fffffffffffffdde & 1) != 0) {
      Qt::Literals::StringLiterals::operator____L1
                ((char *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8),
                 (size_t)in_stack_fffffffffffffdc0);
      QString::append(in_RDX);
      local_1d1 = 1;
      goto LAB_00acbe6c;
    }
  }
  else {
    QByteArray::QByteArray(&local_118,"GNOME",-1);
    in_stack_fffffffffffffdcf =
         operator==((QByteArray *)in_stack_fffffffffffffdd0,
                    (QByteArray *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
    QByteArray::~QByteArray((QByteArray *)0xacbd1b);
    if ((in_stack_fffffffffffffdcf & 1) != 0) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(local_148,(Data *)0x0,L"gnome-open",10);
      QString::QString((QString *)in_RDI,
                       (DataPointer *)
                       CONCAT17(in_stack_fffffffffffffdbf,
                                CONCAT16(in_stack_fffffffffffffdbe,
                                         CONCAT15(in_stack_fffffffffffffdbd,
                                                  in_stack_fffffffffffffdb8))));
      bVar2 = checkExecutable((QString *)
                              CONCAT17(in_stack_fffffffffffffddf,
                                       CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)
                                      ),(QString *)in_stack_fffffffffffffdd0);
      QString::~QString((QString *)0xacbdad);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(in_RDI);
      if ((bVar2 & 1) != 0) {
        local_1d1 = 1;
        goto LAB_00acbe6c;
      }
    }
  }
  for (uVar3 = 0; uVar3 < 4; uVar3 = uVar3 + 1) {
    QLatin1String::QLatin1String
              (in_stack_fffffffffffffdd0,
               (char *)CONCAT17(in_stack_fffffffffffffdcf,in_stack_fffffffffffffdc8));
    latin1.m_data = in_stack_fffffffffffffdf8;
    latin1.m_size = uVar3;
    QString::QString((QString *)in_stack_fffffffffffffdd0,latin1);
    bVar2 = checkExecutable((QString *)
                            CONCAT17(in_stack_fffffffffffffddf,
                                     CONCAT16(in_stack_fffffffffffffdde,in_stack_fffffffffffffdd8)),
                            (QString *)in_stack_fffffffffffffdd0);
    QString::~QString((QString *)0xacbe41);
    if ((bVar2 & 1) != 0) {
      local_1d1 = 1;
      goto LAB_00acbe6c;
    }
  }
  local_1d1 = 0;
LAB_00acbe6c:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_1d1 & 1);
}

Assistant:

static inline bool detectWebBrowser(const QByteArray &desktop,
                                    bool checkBrowserVariable,
                                    QString *browser)
{
    const char *browsers[] = {"google-chrome", "firefox", "mozilla", "opera"};

    browser->clear();
    if (checkExecutable(QStringLiteral("xdg-open"), browser))
        return true;

    if (checkBrowserVariable) {
        QString browserVariable = qEnvironmentVariable("DEFAULT_BROWSER");
        if (browserVariable.isEmpty())
            browserVariable = qEnvironmentVariable("BROWSER");
        if (!browserVariable.isEmpty() && checkExecutable(browserVariable, browser))
            return true;
    }

    if (desktop == QByteArray("KDE")) {
        if (checkExecutable(QStringLiteral("kde-open5"), browser))
            return true;
        // Konqueror launcher
        if (checkExecutable(QStringLiteral("kfmclient"), browser)) {
            browser->append(" exec"_L1);
            return true;
        }
    } else if (desktop == QByteArray("GNOME")) {
        if (checkExecutable(QStringLiteral("gnome-open"), browser))
            return true;
    }

    for (size_t i = 0; i < sizeof(browsers)/sizeof(char *); ++i)
        if (checkExecutable(QLatin1StringView(browsers[i]), browser))
            return true;
    return false;
}